

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> __thiscall
booster::locale::impl_posix::num_format<wchar_t>::write_it
          (num_format<wchar_t> *this,ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> out,
          char *ptr,size_t n)

{
  streambuf_type *psVar1;
  char *pcVar2;
  undefined8 unaff_RBP;
  size_t i;
  ulong uVar3;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> oVar4;
  allocator local_69;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> out_local;
  wstring tmp;
  string local_38;
  
  out_local._M_sbuf = out._M_sbuf;
  out_local._M_failed = out._M_failed;
  pcVar2 = nl_langinfo_l(0xe,(__locale_t)
                             *(this->lc_).
                              super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  std::__cxx11::string::string((string *)&local_38,pcVar2,&local_69);
  conv::to_utf<wchar_t>(&tmp,ptr,ptr + n,&local_38,default_method);
  std::__cxx11::string::~string((string *)&local_38);
  for (uVar3 = 0; psVar1 = out_local._M_sbuf, uVar3 < tmp._M_string_length; uVar3 = uVar3 + 1) {
    std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator=
              (&out_local,tmp._M_dataplus._M_p[uVar3]);
  }
  uVar3 = CONCAT71((int7)((ulong)unaff_RBP >> 8),out_local._M_failed);
  std::__cxx11::wstring::~wstring((wstring *)&tmp);
  oVar4._8_8_ = uVar3 & 0xffffffff;
  oVar4._M_sbuf = psVar1;
  return oVar4;
}

Assistant:

std::ostreambuf_iterator<wchar_t> write_it(std::ostreambuf_iterator<wchar_t> out,char const *ptr,size_t n) const
    {
        std::wstring tmp = conv::to_utf<wchar_t>(ptr,ptr+n,nl_langinfo_l(CODESET,*lc_));
        for(size_t i=0;i<tmp.size();i++)
            *out++ = tmp[i];
        return out;
    }